

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
          (ArgBuilder *this,offset_in_ConfigData_to_bool field)

{
  Arg *pAVar1;
  IArgFunction<Catch::ConfigData> *pIVar2;
  long *plVar3;
  IArgFunction<Catch::ConfigData> *pIVar4;
  
  plVar3 = (long *)operator_new(0x10);
  *plVar3 = (long)&PTR__IArgFunction_0016b610;
  plVar3[1] = field;
  pAVar1 = this->m_arg;
  pIVar4 = (IArgFunction<Catch::ConfigData> *)operator_new(0x10);
  pIVar4->_vptr_IArgFunction = (_func_int **)&PTR__IArgFunction_0016b610;
  pIVar4[1]._vptr_IArgFunction = (_func_int **)field;
  pIVar2 = (pAVar1->super_CommonArgProperties<Catch::ConfigData>).boundField.functionObj;
  if (pIVar2 != (IArgFunction<Catch::ConfigData> *)0x0) {
    (*pIVar2->_vptr_IArgFunction[1])();
  }
  (pAVar1->super_CommonArgProperties<Catch::ConfigData>).boundField.functionObj = pIVar4;
  (**(code **)(*plVar3 + 8))(plVar3);
  return;
}

Assistant:

void bind( bool C::* field ) {
                m_arg->boundField = new Detail::BoundDataMember<C,bool>( field );
            }